

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O2

OPTIONHANDLER_HANDLE retry_control_retrieve_options(RETRY_CONTROL_HANDLE retry_control_handle)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (retry_control_handle == (RETRY_CONTROL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar4 = "Failed to retrieve options (retry_state_handle is NULL)";
    iVar3 = 0x1d6;
LAB_001309bc:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
              ,"retry_control_retrieve_options",iVar3,1,pcVar4);
    return (OPTIONHANDLER_HANDLE)0x0;
  }
  handle = OptionHandler_Create
                     (retry_control_clone_option,retry_control_destroy_option,
                      retry_control_set_option);
  if (handle == (OPTIONHANDLER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar4 = "Failed to retrieve options (OptionHandler_Create failed)";
    iVar3 = 0x1df;
    goto LAB_001309bc;
  }
  OVar1 = OptionHandler_AddOption
                    (handle,"initial_wait_time_in_secs",
                     &retry_control_handle->initial_wait_time_in_secs);
  if (OVar1 == OPTIONHANDLER_OK) {
    OVar1 = OptionHandler_AddOption
                      (handle,"max_jitter_percent",&retry_control_handle->max_jitter_percent);
    if (OVar1 == OPTIONHANDLER_OK) {
      return handle;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00130a13;
    iVar3 = 0x1ed;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00130a13;
    iVar3 = 0x1e8;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
            ,"retry_control_retrieve_options",iVar3,1,
            "Failed to retrieve options (OptionHandler_Create failed for option \'%s\')",
            "initial_wait_time_in_secs");
LAB_00130a13:
  OptionHandler_Destroy(handle);
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

OPTIONHANDLER_HANDLE retry_control_retrieve_options(RETRY_CONTROL_HANDLE retry_control_handle)
{
    OPTIONHANDLER_HANDLE result;

    if (retry_control_handle == NULL)
    {
        LogError("Failed to retrieve options (retry_state_handle is NULL)");
        result = NULL;
    }
    else
    {
        OPTIONHANDLER_HANDLE options = OptionHandler_Create(retry_control_clone_option, retry_control_destroy_option, (pfSetOption)retry_control_set_option);

        if (options == NULL)
        {
            LogError("Failed to retrieve options (OptionHandler_Create failed)");
            result = NULL;
        }
        else
        {
            RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

            if (OptionHandler_AddOption(options, RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, (void*)&retry_control->initial_wait_time_in_secs) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options (OptionHandler_Create failed for option '%s')", RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS);
                result = NULL;
            }
            else if (OptionHandler_AddOption(options, RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT, (void*)&retry_control->max_jitter_percent) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options (OptionHandler_Create failed for option '%s')", RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS);
                result = NULL;
            }
            else
            {
                result = options;
            }

            if (result == NULL)
            {
                OptionHandler_Destroy(options);
            }
        }
    }

    return result;
}